

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

void vkt::SpirVAssembly::(anonymous_namespace)::fillRandomInt64sLogDistributed<bool(*)(long)>
               (Random *rnd,vector<long,_std::allocator<long>_> *dst,int numValues,
               _func_bool_long *filter)

{
  bool bVar1;
  deInt64 dVar2;
  reference pvVar3;
  deInt64 value;
  int ndx;
  _func_bool_long *filter_local;
  int numValues_local;
  vector<long,_std::allocator<long>_> *dst_local;
  Random *rnd_local;
  
  for (value._4_4_ = 0; value._4_4_ < numValues; value._4_4_ = value._4_4_ + 1) {
    do {
      dVar2 = anon_unknown_5::randomInt64LogDistributed(rnd);
      bVar1 = (*filter)(dVar2);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](dst,(long)value._4_4_);
    *pvVar3 = dVar2;
  }
  return;
}

Assistant:

static void fillRandomInt64sLogDistributed (de::Random& rnd, vector<deInt64>& dst, int numValues, FilterT filter)
{
	for (int ndx = 0; ndx < numValues; ndx++)
	{
		deInt64 value;
		do {
			value = randomInt64LogDistributed(rnd);
		} while (!filter(value));
		dst[ndx] = value;
	}
}